

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpio.c
# Opt level: O1

void t7(void)

{
  int iVar1;
  
  puts("Watchdog tests.");
  t7_count = 0;
  gpioSetAlertFunc(0x19,t7cbf);
  gpioSetWatchdog(0x19,0x32);
  time_sleep(0x3fe0000000000000);
  iVar1 = t7_count;
  time_sleep(0x4000000000000000);
  CHECK(7,1,t7_count - iVar1,0x27,5,"set watchdog on count");
  gpioSetWatchdog(0x19,0);
  time_sleep(0x3fe0000000000000);
  iVar1 = t7_count;
  time_sleep(0x4000000000000000);
  CHECK(7,2,t7_count - iVar1,0,1,"set watchdog off count");
  return;
}

Assistant:

void t7()
{
   int c, oc;

   printf("Watchdog tests.\n");

   t7_count=0;

   /* type of edge shouldn't matter for watchdogs */
   gpioSetAlertFunc(GPIO, t7cbf);

   gpioSetWatchdog(GPIO, 50); /* 50 ms, 20 per second */
   time_sleep(0.5);
   oc = t7_count;
   time_sleep(2);
   c = t7_count - oc;
   CHECK(7, 1, c, 39, 5, "set watchdog on count");

   gpioSetWatchdog(GPIO, 0); /* 0 switches watchdog off */
   time_sleep(0.5);
   oc = t7_count;
   time_sleep(2);
   c = t7_count - oc;
   CHECK(7, 2, c, 0, 1, "set watchdog off count");
}